

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O3

void set_width_equals_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Ptr pvVar3;
  Am_Object win;
  Am_Object AStack_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_10,(Am_Slot_Key)&AStack_18,10);
  Am_Object::~Am_Object(&AStack_18);
  pAVar2 = Am_Object::Get(&local_10,0xfa,0);
  pvVar3 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)&local_10,(ulong)Am_WIDTH_HOW);
  pAVar2 = Am_Object::Get(&AStack_18,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *(int *)((long)pvVar3 + 8) = iVar1;
  Am_Object::~Am_Object(&AStack_18);
  iVar1 = *(int *)((long)pvVar3 + 0x30);
  Am_Object::Get_Object(&AStack_18,(Am_Slot_Key)&local_10,(ulong)Am_WIDTH_AMOUNT_WIDGET);
  Am_Object::Set(&AStack_18,0x169,iVar1,0);
  Am_Object::~Am_Object(&AStack_18);
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_width_equals, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->width_control = win.Get_Object(Am_WIDTH_HOW).Get(Am_VALUE);
  int val = loc_values->width_equals;
  win.Get_Object(Am_WIDTH_AMOUNT_WIDGET).Set(Am_VALUE, val);
}